

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_s2c_ecdsa_point_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256_initialize(sha);
  sha->s[0] = 0xa9b21c7b;
  sha->s[1] = 0x358c3e3e;
  sha->s[2] = 0xb6863d1;
  sha->s[3] = 0xc62b2035;
  sha->s[4] = 0xb44b40ce;
  sha->s[5] = 0x254a8912;
  sha->s[6] = 0xf85d0d4;
  sha->s[7] = 0x8a5bf91c;
  sha->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_s2c_ecdsa_point_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0xa9b21c7bul;
    sha->s[1] = 0x358c3e3eul;
    sha->s[2] = 0x0b6863d1ul;
    sha->s[3] = 0xc62b2035ul;
    sha->s[4] = 0xb44b40ceul;
    sha->s[5] = 0x254a8912ul;
    sha->s[6] = 0x0f85d0d4ul;
    sha->s[7] = 0x8a5bf91cul;

    sha->bytes = 64;
}